

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O1

void gravity_well_explode(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  CHAR_DATA *ch;
  CHAR_DATA *pCVar1;
  int idam;
  bool bVar2;
  int iVar3;
  bool bVar4;
  OBJ_DATA *obj;
  CHAR_DATA *pCVar5;
  
  ch = af->owner;
  affect_strip_area(room->area,(int)gsn_gravity_well);
  obj = object_list;
  while( true ) {
    if (obj == (OBJ_DATA *)0x0) {
      return;
    }
    if ((obj->item_type == 0x26) && (obj->in_room != (ROOM_INDEX_DATA *)0x0 && obj->in_room == room)
       ) break;
    obj = obj->next;
  }
  send_to_char("You lose control of your gravity well and it ruptures violently!\n\r",ch);
  pCVar5 = obj->in_room->people;
  if (pCVar5 != (CHAR_DATA *)0x0) {
    act("The gravity well flares brightly and explodes, sending waves of force rippling outward!",
        pCVar5,(void *)0x0,(void *)0x0,4);
  }
  extract_obj(obj);
  affect_strip_room(room,(int)gsn_gravity_well);
  if (room->people == (CHAR_DATA *)0x0) {
    return;
  }
  bVar4 = true;
  pCVar5 = room->people;
  do {
    pCVar1 = pCVar5->next_in_room;
    bVar2 = is_npc(pCVar5);
    if ((bVar2) || (bVar2 = is_safe_new(ch,pCVar5,false), !bVar2)) {
      iVar3 = dice(0x14,0x14);
      idam = iVar3 / 2;
      if (ch != pCVar5) {
        idam = iVar3;
      }
      if (ch->in_room == (ROOM_INDEX_DATA *)0x0) {
        char_to_room(ch,room);
        bVar4 = false;
      }
      damage_new(ch,pCVar5,idam,(int)af->type,0xb,true,false,0,1,"the violent explosion*");
      if (!bVar4) {
        char_from_room(ch);
      }
    }
    pCVar5 = pCVar1;
  } while (pCVar1 != (CHAR_DATA *)0x0);
  return;
}

Assistant:

void gravity_well_explode(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim, *v_next, *ch = af->owner;
	OBJ_DATA *well;
	int dam;
	bool wasinroom = true;

	affect_strip_area(room->area, gsn_gravity_well);

	for (well = object_list; well != nullptr; well = well->next)
	{
		if (well->item_type == ITEM_GRAVITYWELL && well->in_room && well->in_room == room)
			break;
	}

	if (!well)
		return;

	send_to_char("You lose control of your gravity well and it ruptures violently!\n\r", ch);

	if (well->in_room->people)
		act("The gravity well flares brightly and explodes, sending waves of force rippling outward!", well->in_room->people, 0, 0, TO_ALL);

	extract_obj(well);
	affect_strip_room(room, gsn_gravity_well);

	for (victim = room->people; victim != nullptr; victim = v_next)
	{
		v_next = victim->next_in_room;

		if (!is_npc(victim) && is_safe_new(ch, victim, false))
			continue;

		dam = dice(20, 20);

		if (ch == victim)
			dam /= 2;

		if (!ch->in_room)
		{
			char_to_room(ch, room);
			wasinroom = false;
		}

		damage_new(ch, victim, dam, af->type, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the violent explosion*");

		if (!wasinroom)
			char_from_room(ch);
	}
}